

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

int __thiscall
Fl_Browser_::select(Fl_Browser_ *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                   fd_set *__exceptfds,timeval *__timeout)

{
  uint *puVar1;
  void *pvVar2;
  int iVar3;
  undefined4 in_register_00000034;
  void *item;
  int iVar4;
  
  item = (void *)CONCAT44(in_register_00000034,__nfds);
  iVar4 = (int)__readfds;
  if ((this->super_Fl_Group).super_Fl_Widget.type_ == '\x03') {
    pvVar2 = this->selection_;
    if (pvVar2 != item) {
      if (pvVar2 != (void *)0x0) {
        redraw_line(this,pvVar2);
      }
      this->selection_ = item;
      redraw_line(this,item);
    }
    iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,item);
    if ((iVar3 != 0) != (iVar4 == 0)) {
      return 0;
    }
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x18])
              (this,item,(ulong)__readfds & 0xffffffff);
    redraw_line(this,item);
  }
  else {
    pvVar2 = this->selection_;
    if ((iVar4 != 0) == (pvVar2 == item)) {
      return 0;
    }
    if (pvVar2 != (void *)0x0) {
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x18])(this,pvVar2,0);
      redraw_line(this,this->selection_);
      this->selection_ = (void *)0x0;
    }
    if (iVar4 != 0) {
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x18])(this,item,1);
      this->selection_ = item;
      redraw_line(this,item);
      display(this,item);
    }
  }
  if ((int)__writefds != 0) {
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    Fl_Widget::do_callback((Fl_Widget *)this);
  }
  return 1;
}

Assistant:

int Fl_Browser_::select(void* item, int val, int docallbacks) {
  if (type() == FL_MULTI_BROWSER) {
    if (selection_ != item) {
      if (selection_) redraw_line(selection_);
      selection_ = item;
      redraw_line(item);
    }
    if ((!val)==(!item_selected(item))) return 0;
    item_select(item, val);
    redraw_line(item);
  } else {
    if (val && selection_ == item) return 0;
    if (!val && selection_ != item) return 0;
    if (selection_) {
      item_select(selection_, 0);
      redraw_line(selection_);
      selection_ = 0;
    }
    if (val) {
      item_select(item, 1);
      selection_ = item;
      redraw_line(item);
      display(item);
    }
  }	    
  if (docallbacks) {
    set_changed();
    do_callback();
  }
  return 1;
}